

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

bool __thiscall
QToolBarAreaLayoutInfo::insertGap(QToolBarAreaLayoutInfo *this,QList<int> *path,QLayoutItem *item)

{
  Orientation OVar1;
  int iVar2;
  long *plVar3;
  QSize QVar4;
  Representation RVar5;
  long lVar6;
  char cVar7;
  pointer pQVar8;
  pointer pQVar9;
  QSize QVar10;
  int newSize;
  ulong uVar11;
  long i;
  long i_00;
  long in_FS_OFFSET;
  QToolBarAreaLayoutLine local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  i = (long)*(path->d).ptr;
  if ((this->lines).d.size == i) {
    local_68.rect.x1.m_i = 0;
    local_68.rect.y1.m_i = 0;
    local_68.rect.x2.m_i = -1;
    local_68.rect.y2.m_i = -1;
    local_68.o = this->o;
    local_68.toolBarItems.d.d = (Data *)0x0;
    local_68.toolBarItems.d.ptr = (QToolBarAreaLayoutItem *)0x0;
    local_68.toolBarItems.d.size = 0;
    QtPrivate::QMovableArrayOps<QToolBarAreaLayoutLine>::emplace<QToolBarAreaLayoutLine>
              ((QMovableArrayOps<QToolBarAreaLayoutLine> *)this,i,&local_68);
    QList<QToolBarAreaLayoutLine>::end(&this->lines);
    if (&(local_68.toolBarItems.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_68.toolBarItems.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_68.toolBarItems.d.d)->super_QArrayData,0x18,0x10);
      }
    }
  }
  pQVar8 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
  i_00 = (long)(path->d).ptr[1];
  local_68.rect.x2.m_i = 0;
  local_68.rect.y2.m_i = -1;
  local_68.o = 0xffffffff;
  local_68._20_4_ = 0xaaaaaa01;
  local_68.rect._0_8_ = item;
  if (0 < i_00) {
    uVar11 = i_00 + 1;
    lVar6 = i_00 * 0x18;
    do {
      pQVar9 = QList<QToolBarAreaLayoutItem>::data(&pQVar8[i].toolBarItems);
      if (((&pQVar9[-1].gap)[lVar6] != false) ||
         ((plVar3 = *(long **)((long)&pQVar9[-1].widgetItem + lVar6), plVar3 != (long *)0x0 &&
          (cVar7 = (**(code **)(*plVar3 + 0x40))(), cVar7 == '\0')))) {
        OVar1 = pQVar8[i].o;
        QVar10 = QToolBarAreaLayoutItem::sizeHint
                           ((QToolBarAreaLayoutItem *)((long)&pQVar9[-1].widgetItem + lVar6));
        QVar4 = (QSize)((ulong)QVar10 >> 0x20);
        if (OVar1 == Horizontal) {
          QVar4 = QVar10;
        }
        RVar5 = QVar4.wd.m_i;
        iVar2 = *(int *)((long)&pQVar9[-1].size + lVar6);
        newSize = iVar2 - RVar5.m_i;
        if (newSize != 0 && RVar5.m_i <= iVar2) {
          *(undefined4 *)((long)&pQVar9[-1].preferredSize + lVar6) = 0xffffffff;
          *(int *)((long)&pQVar9[-1].size + lVar6) = RVar5.m_i;
          QToolBarAreaLayoutItem::resize((QToolBarAreaLayoutItem *)&local_68,this->o,newSize);
        }
        break;
      }
      uVar11 = uVar11 - 1;
      lVar6 = lVar6 + -0x18;
    } while (1 < uVar11);
  }
  QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem_const&>
            ((QPodArrayOps<QToolBarAreaLayoutItem> *)&pQVar8[i].toolBarItems,i_00,
             (QToolBarAreaLayoutItem *)&local_68);
  QList<QToolBarAreaLayoutItem>::begin(&pQVar8[i].toolBarItems);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool QToolBarAreaLayoutInfo::insertGap(const QList<int> &path, QLayoutItem *item)
{
    Q_ASSERT(path.size() == 2);
    int j = path.first();
    if (j == lines.size())
        lines.append(QToolBarAreaLayoutLine(o));

    QToolBarAreaLayoutLine &line = lines[j];
    const int k = path.at(1);

    QToolBarAreaLayoutItem gap_item;
    gap_item.gap = true;
    gap_item.widgetItem = item;

    //update the previous item's preferred size
    for(int p = k - 1 ; p >= 0; --p) {
        QToolBarAreaLayoutItem &previous = line.toolBarItems[p];
        if (!previous.skip()) {
            //we found the previous one
            int previousSizeHint = pick(line.o, previous.sizeHint());
            int previousExtraSpace = previous.size - previousSizeHint;

            if (previousExtraSpace > 0) {
                //in this case we reset the space
                previous.preferredSize = -1;
                previous.size = previousSizeHint;

                gap_item.resize(o, previousExtraSpace);
            }

            break;
        }
    }

    line.toolBarItems.insert(k, gap_item);
    return true;

}